

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O0

char * __thiscall Fl_GTK_File_Chooser::filename(Fl_GTK_File_Chooser *this,int i)

{
  gboolean gVar1;
  char *nm;
  GSList *iter;
  int i_local;
  Fl_GTK_File_Chooser *this_local;
  
  gVar1 = (*fl_gtk_file_chooser_get_select_multiple)((GtkFileChooser *)this->gtkw_ptr);
  if (gVar1 == 0) {
    this_local = (Fl_GTK_File_Chooser *)this->gtkw_filename;
  }
  else if ((uint)i < this->gtkw_count) {
    this_local = (Fl_GTK_File_Chooser *)(*fl_g_slist_nth_data)((GSList *)this->gtkw_slist,i);
  }
  else {
    this_local = (Fl_GTK_File_Chooser *)0x27f09e;
  }
  return (char *)this_local;
}

Assistant:

const char *Fl_GTK_File_Chooser::filename(int i) const
{
  if(fl_gtk_file_chooser_get_select_multiple((GtkFileChooser *)gtkw_ptr) == FALSE) {
    return gtkw_filename;
  }
  else {
    if ((unsigned)i < gtkw_count) {
      GSList *iter = (GSList *)gtkw_slist;
      char *nm = (char *)fl_g_slist_nth_data(iter, i);
      return nm;
    }
  }
  return("");
}